

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O1

void dfsfast_preorder(Abc_Ntk_t *pNtk)

{
  ushort uVar1;
  Vec_Int_t *pVVar2;
  long *plVar3;
  long lVar4;
  Abc_Obj_t *__ptr;
  int *piVar5;
  MinRegMan_t *pMVar6;
  uint *__ptr_00;
  void *pvVar7;
  Vec_Int_t *p;
  int *piVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  void *pvVar11;
  Flow_Data_t *pFVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  
  uVar13 = pNtk->nObjs;
  __ptr_00 = (uint *)malloc(0x10);
  uVar14 = 8;
  if (6 < uVar13 - 1) {
    uVar14 = uVar13;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = uVar14;
  if (uVar14 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc((long)(int)uVar14 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar7;
  p = (Vec_Int_t *)malloc(0x10);
  if (uVar13 - 1 < 0xf) {
    uVar13 = 0x10;
  }
  p->nSize = 0;
  p->nCap = uVar13;
  if (uVar13 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)(int)uVar13 << 2);
  }
  p->pArray = piVar8;
  if ((pManMR->maxDelay != 0) && (pVVar9 = pNtk->vObjs, 0 < pVVar9->nSize)) {
    lVar19 = 0;
    do {
      pvVar7 = pVVar9->pArray[lVar19];
      if (pvVar7 != (void *)0x0) {
        if (0 < pManMR->vTimeEdges[*(uint *)((long)pvVar7 + 0x10)].nSize) {
          pVVar9 = pManMR->vTimeEdges + *(uint *)((long)pvVar7 + 0x10);
          lVar15 = 0;
          do {
            pFVar12 = pManMR->pDataArray;
            uVar13 = *(uint *)((long)pVVar9->pArray[lVar15] + 0x10);
            pVVar9 = pFVar12[uVar13].field_1.vNodes;
            if (pVVar9 == (Vec_Ptr_t *)0x0) {
              pVVar9 = (Vec_Ptr_t *)malloc(0x10);
              pVVar9->nCap = 8;
              pVVar9->nSize = 0;
              ppvVar10 = (void **)malloc(0x40);
              pVVar9->pArray = ppvVar10;
              pFVar12[uVar13].field_1.vNodes = pVVar9;
            }
            uVar13 = pVVar9->nCap;
            if (pVVar9->nSize == uVar13) {
              if ((int)uVar13 < 0x10) {
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc(0x80);
                }
                else {
                  ppvVar10 = (void **)realloc(pVVar9->pArray,0x80);
                }
                pVVar9->pArray = ppvVar10;
                iVar16 = 0x10;
              }
              else {
                iVar16 = uVar13 * 2;
                if (iVar16 <= (int)uVar13) goto LAB_004d73c2;
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc((ulong)uVar13 << 4);
                }
                else {
                  ppvVar10 = (void **)realloc(pVVar9->pArray,(ulong)uVar13 << 4);
                }
                pVVar9->pArray = ppvVar10;
              }
              pVVar9->nCap = iVar16;
            }
LAB_004d73c2:
            iVar16 = pVVar9->nSize;
            pVVar9->nSize = iVar16 + 1;
            pVVar9->pArray[iVar16] = pvVar7;
            lVar15 = lVar15 + 1;
            pVVar9 = pManMR->vTimeEdges + *(uint *)((long)pvVar7 + 0x10);
          } while (lVar15 < pManMR->vTimeEdges[*(uint *)((long)pvVar7 + 0x10)].nSize);
        }
      }
      lVar19 = lVar19 + 1;
      pVVar9 = pNtk->vObjs;
    } while (lVar19 < pVVar9->nSize);
  }
  pVVar2 = pManMR->vSinkDistHist;
  if (pVVar2 == (Vec_Int_t *)0x0) {
    __assert_fail("pManMR->vSinkDistHist",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretFlow.c"
                  ,0x4d,"void dfsfast_preorder(Abc_Ntk_t *)");
  }
  memset(pVVar2->pArray,0,(long)pVVar2->nSize << 2);
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar19 = 0;
    do {
      pvVar7 = pVVar9->pArray[lVar19];
      if (pvVar7 != (void *)0x0) {
        uVar13 = *(uint *)((long)pvVar7 + 0x14) & 0xf;
        if (((uVar13 == 3) || (uVar13 == 8)) ||
           ((pManMR->fIsForward != 0 &&
            ((*(uint *)(pManMR->pDataArray + *(uint *)((long)pvVar7 + 0x10)) &
              pManMR->constraintMask & 0x90) != 0)))) {
          uVar13 = *__ptr_00;
          uVar14 = 0xffff;
          iVar16 = 0x72;
          if (__ptr_00[1] == uVar13) {
            if ((int)uVar13 < 0x10) {
              if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                pvVar11 = malloc(0x80);
              }
              else {
                pvVar11 = realloc(*(void **)(__ptr_00 + 2),0x80);
              }
              uVar17 = 0x10000;
              uVar14 = 0xffff;
              iVar16 = 0x72;
LAB_004d7591:
              uVar18 = 0x10;
            }
            else {
              uVar17 = 0x10000;
              uVar18 = uVar13 * 2;
              if ((int)uVar18 <= (int)uVar13) goto LAB_004d75c0;
              if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                pvVar11 = malloc((ulong)uVar13 << 4);
              }
              else {
                pvVar11 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar13 << 4);
              }
              uVar17 = 0x10000;
              uVar14 = 0xffff;
              iVar16 = 0x72;
            }
LAB_004d75b9:
            *(void **)(__ptr_00 + 2) = pvVar11;
            *__ptr_00 = uVar18;
          }
          else {
            uVar17 = 0x10000;
          }
        }
        else {
          if ((uVar13 != 2) &&
             ((pManMR->fIsForward != 0 ||
              ((*(uint *)(pManMR->pDataArray + *(uint *)((long)pvVar7 + 0x10)) &
                pManMR->constraintMask & 0x90) == 0)))) goto LAB_004d7604;
          uVar13 = *__ptr_00;
          uVar14 = 0xffff0000;
          iVar16 = 0x65;
          if (__ptr_00[1] == uVar13) {
            if ((int)uVar13 < 0x10) {
              if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                pvVar11 = malloc(0x80);
              }
              else {
                pvVar11 = realloc(*(void **)(__ptr_00 + 2),0x80);
              }
              uVar17 = 1;
              uVar14 = 0xffff0000;
              iVar16 = 0x65;
              goto LAB_004d7591;
            }
            uVar17 = 1;
            uVar18 = uVar13 * 2;
            if ((int)uVar13 < (int)uVar18) {
              if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                pvVar11 = malloc((ulong)uVar13 << 4);
              }
              else {
                pvVar11 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar13 << 4);
              }
              uVar17 = 1;
              uVar14 = 0xffff0000;
              iVar16 = 0x65;
              goto LAB_004d75b9;
            }
          }
          else {
            uVar17 = 1;
          }
        }
LAB_004d75c0:
        uVar13 = __ptr_00[1];
        __ptr_00[1] = uVar13 + 1;
        *(void **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar13 * 8) = pvVar7;
        Vec_IntPush(p,iVar16);
        *(uint *)&pManMR->pDataArray[*(uint *)((long)pvVar7 + 0x10)].field_0x10 =
             uVar14 & *(uint *)&pManMR->pDataArray[*(uint *)((long)pvVar7 + 0x10)].field_0x10 |
             uVar17;
      }
LAB_004d7604:
      lVar19 = lVar19 + 1;
      pVVar9 = pNtk->vObjs;
    } while (lVar19 < pVVar9->nSize);
  }
  if (0 < (int)__ptr_00[1]) {
    lVar19 = 0;
    do {
      plVar3 = *(long **)(*(long *)(__ptr_00 + 2) + lVar19 * 8);
      if (plVar3 == (long *)0x0) {
        __assert_fail("pObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretFlow.c"
                      ,0x62,"void dfsfast_preorder(Abc_Ntk_t *)");
      }
      if (p->nSize <= lVar19) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->pArray[lVar19] == 0x72) {
        uVar13 = *(uint *)&pManMR->pDataArray[*(uint *)(plVar3 + 2)].field_0x10;
        uVar14 = uVar13 >> 0x10;
        if (pManMR->fIsForward == 0) {
          if (0 < *(int *)((long)plVar3 + 0x2c)) {
            lVar15 = 0;
            do {
              lVar4 = *(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[6] + lVar15 * 4) * 8);
              uVar17 = *(uint *)(lVar4 + 0x10);
              uVar18 = *(uint *)&pManMR->pDataArray[uVar17].field_0x10;
              if ((short)uVar18 == 0) {
                *(uint *)&pManMR->pDataArray[uVar17].field_0x10 = uVar18 | uVar14 + 1 & 0xffff;
                uVar17 = *__ptr_00;
                if (__ptr_00[1] == uVar17) {
                  if ((int)uVar17 < 0x10) {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar7 = malloc(0x80);
                    }
                    else {
                      pvVar7 = realloc(*(void **)(__ptr_00 + 2),0x80);
                    }
                    uVar18 = 0x10;
                  }
                  else {
                    uVar18 = uVar17 * 2;
                    if ((int)uVar18 <= (int)uVar17) goto LAB_004d7915;
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar7 = malloc((ulong)uVar17 << 4);
                    }
                    else {
                      pvVar7 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar17 << 4);
                    }
                  }
                  *(void **)(__ptr_00 + 2) = pvVar7;
                  *__ptr_00 = uVar18;
                }
LAB_004d7915:
                uVar17 = __ptr_00[1];
                __ptr_00[1] = uVar17 + 1;
                *(long *)(*(long *)(__ptr_00 + 2) + (long)(int)uVar17 * 8) = lVar4;
                Vec_IntPush(p,0x65);
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < *(int *)((long)plVar3 + 0x2c));
          }
        }
        else if (0 < *(int *)((long)plVar3 + 0x1c)) {
          lVar15 = 0;
          do {
            lVar4 = *(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                             (long)*(int *)(plVar3[4] + lVar15 * 4) * 8);
            uVar17 = *(uint *)(lVar4 + 0x10);
            uVar18 = *(uint *)&pManMR->pDataArray[uVar17].field_0x10;
            if ((short)uVar18 == 0) {
              *(uint *)&pManMR->pDataArray[uVar17].field_0x10 = uVar18 | uVar14 + 1 & 0xffff;
              uVar17 = *__ptr_00;
              if (__ptr_00[1] == uVar17) {
                if ((int)uVar17 < 0x10) {
                  if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                    pvVar7 = malloc(0x80);
                  }
                  else {
                    pvVar7 = realloc(*(void **)(__ptr_00 + 2),0x80);
                  }
                  uVar18 = 0x10;
                }
                else {
                  uVar18 = uVar17 * 2;
                  if ((int)uVar18 <= (int)uVar17) goto LAB_004d779d;
                  if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                    pvVar7 = malloc((ulong)uVar17 << 4);
                  }
                  else {
                    pvVar7 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar17 << 4);
                  }
                }
                *(void **)(__ptr_00 + 2) = pvVar7;
                *__ptr_00 = uVar18;
              }
LAB_004d779d:
              uVar17 = __ptr_00[1];
              __ptr_00[1] = uVar17 + 1;
              *(long *)(*(long *)(__ptr_00 + 2) + (long)(int)uVar17 * 8) = lVar4;
              Vec_IntPush(p,0x65);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(int *)((long)plVar3 + 0x1c));
        }
        if ((uVar14 != 1) && (pManMR->fIsForward != 0)) {
          if (0 < *(int *)((long)plVar3 + 0x2c)) {
            lVar15 = 0;
            do {
              lVar4 = *(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[6] + lVar15 * 4) * 8);
              uVar14 = *(uint *)&pManMR->pDataArray[*(uint *)(lVar4 + 0x10)].field_0x10;
              if ((uVar14 < 0x10000) && ((*(uint *)(lVar4 + 0x14) & 0xf) != 8)) {
                *(uint *)&pManMR->pDataArray[*(uint *)(lVar4 + 0x10)].field_0x10 =
                     uVar14 | (uVar13 & 0xffff0000) + 0x10000;
                uVar14 = *__ptr_00;
                if (__ptr_00[1] == uVar14) {
                  if ((int)uVar14 < 0x10) {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar7 = malloc(0x80);
                    }
                    else {
                      pvVar7 = realloc(*(void **)(__ptr_00 + 2),0x80);
                    }
                    uVar17 = 0x10;
                  }
                  else {
                    uVar17 = uVar14 * 2;
                    if ((int)uVar17 <= (int)uVar14) goto LAB_004d7a46;
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar7 = malloc((ulong)uVar14 << 4);
                    }
                    else {
                      pvVar7 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar14 << 4);
                    }
                  }
                  *(void **)(__ptr_00 + 2) = pvVar7;
                  *__ptr_00 = uVar17;
                }
LAB_004d7a46:
                uVar14 = __ptr_00[1];
                __ptr_00[1] = uVar14 + 1;
                *(long *)(*(long *)(__ptr_00 + 2) + (long)(int)uVar14 * 8) = lVar4;
                Vec_IntPush(p,0x72);
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < *(int *)((long)plVar3 + 0x2c));
          }
          if ((pManMR->maxDelay != 0) &&
             (pManMR->pDataArray[*(uint *)(plVar3 + 2)].field_1.pred != (Abc_Obj_t *)0x0)) {
            pFVar12 = pManMR->pDataArray;
            pVVar9 = pFVar12[*(uint *)(plVar3 + 2)].field_1.vNodes;
            if (0 < pVVar9->nSize) {
              lVar15 = 0;
              do {
                pvVar7 = pVVar9->pArray[lVar15];
                uVar14 = *(uint *)((long)pvVar7 + 0x10);
                if (*(uint *)&pFVar12[uVar14].field_0x10 < 0x10000) {
                  *(uint *)&pFVar12[uVar14].field_0x10 =
                       *(uint *)&pFVar12[uVar14].field_0x10 | (uVar13 & 0xffff0000) + 0x10000;
                  uVar14 = *__ptr_00;
                  if (__ptr_00[1] == uVar14) {
                    if ((int)uVar14 < 0x10) {
                      if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                        pvVar11 = malloc(0x80);
                      }
                      else {
                        pvVar11 = realloc(*(void **)(__ptr_00 + 2),0x80);
                      }
                      uVar17 = 0x10;
                    }
                    else {
                      uVar17 = uVar14 * 2;
                      if ((int)uVar17 <= (int)uVar14) goto LAB_004d7b67;
                      if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                        pvVar11 = malloc((ulong)uVar14 << 4);
                      }
                      else {
                        pvVar11 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar14 << 4);
                      }
                    }
                    *(void **)(__ptr_00 + 2) = pvVar11;
                    *__ptr_00 = uVar17;
                  }
LAB_004d7b67:
                  uVar14 = __ptr_00[1];
                  __ptr_00[1] = uVar14 + 1;
                  *(void **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar14 * 8) = pvVar7;
                  Vec_IntPush(p,0x72);
                }
                lVar15 = lVar15 + 1;
                pFVar12 = pManMR->pDataArray;
                pVVar9 = pFVar12[*(uint *)(plVar3 + 2)].field_1.vNodes;
              } while (lVar15 < pVVar9->nSize);
            }
          }
        }
      }
      else if ((*(uint *)((long)plVar3 + 0x14) & 0xf) != 8) {
        uVar13 = *(uint *)&pManMR->pDataArray[*(uint *)(plVar3 + 2)].field_0x10;
        if (uVar13 < 0x10000) {
          *(uint *)&pManMR->pDataArray[*(uint *)(plVar3 + 2)].field_0x10 =
               uVar13 * 0x10001 + 0x10000;
          uVar14 = *__ptr_00;
          if (__ptr_00[1] == uVar14) {
            if ((int)uVar14 < 0x10) {
              if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                pvVar7 = malloc(0x80);
              }
              else {
                pvVar7 = realloc(*(void **)(__ptr_00 + 2),0x80);
              }
              uVar17 = 0x10;
            }
            else {
              uVar17 = uVar14 * 2;
              if ((int)uVar17 <= (int)uVar14) goto LAB_004d7bf9;
              if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                pvVar7 = malloc((ulong)uVar14 << 4);
              }
              else {
                pvVar7 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar14 << 4);
              }
            }
            *(void **)(__ptr_00 + 2) = pvVar7;
            *__ptr_00 = uVar17;
          }
LAB_004d7bf9:
          uVar14 = __ptr_00[1];
          __ptr_00[1] = uVar14 + 1;
          *(long **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar14 * 8) = plVar3;
          Vec_IntPush(p,0x72);
        }
        if (pManMR->fIsForward == 0) {
          if (0 < *(int *)((long)plVar3 + 0x1c)) {
            lVar15 = 0;
            do {
              lVar4 = *(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[4] + lVar15 * 4) * 8);
              uVar14 = *(uint *)&pManMR->pDataArray[*(uint *)(lVar4 + 0x10)].field_0x10;
              if (((short)uVar14 == 0) && ((*(uint *)(lVar4 + 0x14) & 0xf) != 8)) {
                *(uint *)&pManMR->pDataArray[*(uint *)(lVar4 + 0x10)].field_0x10 =
                     uVar14 | uVar13 + 1 & 0xffff;
                uVar14 = *__ptr_00;
                if (__ptr_00[1] == uVar14) {
                  if ((int)uVar14 < 0x10) {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar7 = malloc(0x80);
                    }
                    else {
                      pvVar7 = realloc(*(void **)(__ptr_00 + 2),0x80);
                    }
                    uVar17 = 0x10;
                  }
                  else {
                    uVar17 = uVar14 * 2;
                    if ((int)uVar17 <= (int)uVar14) goto LAB_004d7d0f;
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar7 = malloc((ulong)uVar14 << 4);
                    }
                    else {
                      pvVar7 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar14 << 4);
                    }
                  }
                  *(void **)(__ptr_00 + 2) = pvVar7;
                  *__ptr_00 = uVar17;
                }
LAB_004d7d0f:
                uVar14 = __ptr_00[1];
                __ptr_00[1] = uVar14 + 1;
                *(long *)(*(long *)(__ptr_00 + 2) + (long)(int)uVar14 * 8) = lVar4;
                Vec_IntPush(p,0x65);
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < *(int *)((long)plVar3 + 0x1c));
          }
          if ((pManMR->maxDelay != 0) &&
             (pManMR->pDataArray[*(uint *)(plVar3 + 2)].field_1.pred != (Abc_Obj_t *)0x0)) {
            pFVar12 = pManMR->pDataArray;
            pVVar9 = pFVar12[*(uint *)(plVar3 + 2)].field_1.vNodes;
            if (0 < pVVar9->nSize) {
              lVar15 = 0;
              do {
                pvVar7 = pVVar9->pArray[lVar15];
                uVar14 = *(uint *)((long)pvVar7 + 0x10);
                if ((short)*(uint *)&pFVar12[uVar14].field_0x10 == 0) {
                  *(uint *)&pFVar12[uVar14].field_0x10 =
                       *(uint *)&pFVar12[uVar14].field_0x10 | uVar13 + 1 & 0xffff;
                  uVar14 = *__ptr_00;
                  if (__ptr_00[1] == uVar14) {
                    if ((int)uVar14 < 0x10) {
                      if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                        pvVar11 = malloc(0x80);
                      }
                      else {
                        pvVar11 = realloc(*(void **)(__ptr_00 + 2),0x80);
                      }
                      uVar17 = 0x10;
                    }
                    else {
                      uVar17 = uVar14 * 2;
                      if ((int)uVar17 <= (int)uVar14) goto LAB_004d7e25;
                      if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                        pvVar11 = malloc((ulong)uVar14 << 4);
                      }
                      else {
                        pvVar11 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar14 << 4);
                      }
                    }
                    *(void **)(__ptr_00 + 2) = pvVar11;
                    *__ptr_00 = uVar17;
                  }
LAB_004d7e25:
                  uVar14 = __ptr_00[1];
                  __ptr_00[1] = uVar14 + 1;
                  *(void **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar14 * 8) = pvVar7;
                  Vec_IntPush(p,0x65);
                }
                lVar15 = lVar15 + 1;
                pFVar12 = pManMR->pDataArray;
                pVVar9 = pFVar12[*(uint *)(plVar3 + 2)].field_1.vNodes;
              } while (lVar15 < pVVar9->nSize);
            }
          }
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < (int)__ptr_00[1]);
  }
  if ((pManMR->maxDelay != 0) && (pVVar9 = pNtk->vObjs, 0 < pVVar9->nSize)) {
    lVar19 = 0;
    do {
      pvVar7 = pVVar9->pArray[lVar19];
      if ((pvVar7 != (void *)0x0) &&
         (__ptr = pManMR->pDataArray[*(uint *)((long)pvVar7 + 0x10)].field_1.pred,
         __ptr != (Abc_Obj_t *)0x0)) {
        if (__ptr->pNext != (Abc_Obj_t *)0x0) {
          free(__ptr->pNext);
          __ptr->pNext = (Abc_Obj_t *)0x0;
        }
        free(__ptr);
        pManMR->pDataArray[*(uint *)((long)pvVar7 + 0x10)].field_1.pred = (Abc_Obj_t *)0x0;
      }
      lVar19 = lVar19 + 1;
      pVVar9 = pNtk->vObjs;
    } while (lVar19 < pVVar9->nSize);
  }
  pMVar6 = pManMR;
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    ppvVar10 = pVVar9->pArray;
    lVar19 = 0;
    do {
      pvVar7 = ppvVar10[lVar19];
      if (pvVar7 != (void *)0x0) {
        pVVar2 = pMVar6->vSinkDistHist;
        pFVar12 = pMVar6->pDataArray;
        uVar1 = *(ushort *)&pFVar12[*(uint *)((long)pvVar7 + 0x10)].field_0x12;
        if (pVVar2->nSize <= (int)(uint)uVar1) {
LAB_004d7fe1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar5 = pVVar2->pArray;
        piVar8 = piVar5 + uVar1;
        *piVar8 = *piVar8 + 1;
        uVar1 = *(ushort *)&pFVar12[*(uint *)((long)pvVar7 + 0x10)].field_0x10;
        if (pVVar2->nSize <= (int)(uint)uVar1) goto LAB_004d7fe1;
        piVar5 = piVar5 + uVar1;
        *piVar5 = *piVar5 + 1;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < pVVar9->nSize);
  }
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  if (__ptr_00 != (uint *)0x0) {
    free(__ptr_00);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return;
}

Assistant:

void dfsfast_preorder( Abc_Ntk_t *pNtk ) {
  Abc_Obj_t *pObj, *pNext;
  Vec_Ptr_t *vTimeIn, *qn = Vec_PtrAlloc(Abc_NtkObjNum(pNtk));
  Vec_Int_t *qe = Vec_IntAlloc(Abc_NtkObjNum(pNtk));
  int i, j, d = 0, end;
  int qpos = 0;

  // create reverse timing edges for backward traversal
#if !defined(IGNORE_TIMING)
  if (pManMR->maxDelay) {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      Vec_PtrForEachEntry( Abc_Obj_t *, FTIMEEDGES(pObj), pNext, j ) {
        vTimeIn = FDATA(pNext)->vNodes;
        if (!vTimeIn) {
          vTimeIn = FDATA(pNext)->vNodes = Vec_PtrAlloc(2);
        }
        Vec_PtrPush(vTimeIn, pObj);
      }
    }
  }
#endif

  // clear histogram
  assert(pManMR->vSinkDistHist);
  memset(Vec_IntArray(pManMR->vSinkDistHist), 0, sizeof(int)*Vec_IntSize(pManMR->vSinkDistHist));

  // seed queue : latches, PIOs, and blocks
  Abc_NtkForEachObj( pNtk, pObj, i )
    if (Abc_ObjIsPo(pObj) ||
        Abc_ObjIsLatch(pObj) || 
        (pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
      Vec_PtrPush(qn, pObj);
      Vec_IntPush(qe, 'r');
      FDATA(pObj)->r_dist = 1;
    } else if (Abc_ObjIsPi(pObj) || 
               (!pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
      Vec_PtrPush(qn, pObj);
      Vec_IntPush(qe, 'e');
      FDATA(pObj)->e_dist = 1;
    }

  // until queue is empty...
  while(qpos < Vec_PtrSize(qn)) {
    pObj = (Abc_Obj_t *)Vec_PtrEntry(qn, qpos);
    assert(pObj);
    end = Vec_IntEntry(qe, qpos);
    qpos++;
    
    if (end == 'r') {
      d = FDATA(pObj)->r_dist;

      // 1. structural edges
      if (pManMR->fIsForward) {
        Abc_ObjForEachFanin( pObj, pNext, i )
          if (!FDATA(pNext)->e_dist) {
            FDATA(pNext)->e_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'e');
          }
      } else
        Abc_ObjForEachFanout( pObj, pNext, i )
          if (!FDATA(pNext)->e_dist) {
            FDATA(pNext)->e_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'e');
          }

      if (d == 1) continue;

      // 2. reverse edges (forward retiming only)
      if (pManMR->fIsForward) {
        Abc_ObjForEachFanout( pObj, pNext, i )
          if (!FDATA(pNext)->r_dist && !Abc_ObjIsLatch(pNext)) {
            FDATA(pNext)->r_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'r');
          }          

      // 3. timimg edges (forward retiming only)
#if !defined(IGNORE_TIMING)
        if (pManMR->maxDelay && FDATA(pObj)->vNodes)
          Vec_PtrForEachEntry(Abc_Obj_t *, FDATA(pObj)->vNodes, pNext, i ) {
            if (!FDATA(pNext)->r_dist) {
              FDATA(pNext)->r_dist = d+1;
              Vec_PtrPush(qn, pNext);
              Vec_IntPush(qe, 'r');
            }
          }
#endif
      }
      
    } else { // if 'e'
      if (Abc_ObjIsLatch(pObj)) continue;

      d = FDATA(pObj)->e_dist;

      // 1. through node
      if (!FDATA(pObj)->r_dist) {
        FDATA(pObj)->r_dist = d+1;
        Vec_PtrPush(qn, pObj);
        Vec_IntPush(qe, 'r');
      }

      // 2. reverse edges (backward retiming only)
      if (!pManMR->fIsForward) {
        Abc_ObjForEachFanin( pObj, pNext, i )
          if (!FDATA(pNext)->e_dist && !Abc_ObjIsLatch(pNext)) {
            FDATA(pNext)->e_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'e');
          }  

      // 3. timimg edges (backward retiming only)
#if !defined(IGNORE_TIMING)
        if (pManMR->maxDelay && FDATA(pObj)->vNodes)
          Vec_PtrForEachEntry(Abc_Obj_t *, FDATA(pObj)->vNodes, pNext, i ) {
            if (!FDATA(pNext)->e_dist) {
              FDATA(pNext)->e_dist = d+1;
              Vec_PtrPush(qn, pNext);
              Vec_IntPush(qe, 'e');
            }
          }
#endif
      }
    }
  }
 
  // free time edges
#if !defined(IGNORE_TIMING)
  if (pManMR->maxDelay) {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      vTimeIn = FDATA(pObj)->vNodes;
      if (vTimeIn) {
        Vec_PtrFree(vTimeIn);
        FDATA(pObj)->vNodes = 0;
      }
    }
  }
#endif

  Abc_NtkForEachObj( pNtk, pObj, i ) {
    Vec_IntAddToEntry(pManMR->vSinkDistHist, FDATA(pObj)->r_dist, 1);
    Vec_IntAddToEntry(pManMR->vSinkDistHist, FDATA(pObj)->e_dist, 1);

#ifdef DEBUG_PREORDER
    printf("node %d\t: r=%d\te=%d\n", Abc_ObjId(pObj), FDATA(pObj)->r_dist, FDATA(pObj)->e_dist);
#endif
  }

  // printf("\t\tpre-ordered (max depth=%d)\n", d+1);

  // deallocate
  Vec_PtrFree( qn );
  Vec_IntFree( qe );
}